

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O1

double GetUDMFFloat(int type,int index,char *key)

{
  Node *pNVar1;
  FUDMFKey *pFVar2;
  Node *pNVar3;
  FName local_c;
  
  if (3 < (uint)type) {
    __assert_fail("type >=0 && type <=3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_udmf.cpp"
                  ,0x16b,"double GetUDMFFloat(int, int, const char *)");
  }
  pNVar1 = UDMFKeys[(uint)type].Nodes + (UDMFKeys[(uint)type].Size - 1 & index);
  while ((pNVar3 = pNVar1, pNVar3 != (Node *)0x0 && (pNVar3->Next != (Node *)0x1))) {
    pNVar1 = pNVar3->Next;
    if ((pNVar3->Pair).Key == index) {
LAB_0046062f:
      if (pNVar3 != (Node *)0x0) {
        local_c.Index = FName::NameManager::FindName(&FName::NameData,key,false);
        pFVar2 = FUDMFKeys::Find(&(pNVar3->Pair).Value,&local_c);
        if (pFVar2 != (FUDMFKey *)0x0) {
          return pFVar2->FloatVal;
        }
      }
      return 0.0;
    }
  }
  pNVar3 = (Node *)0x0;
  goto LAB_0046062f;
}

Assistant:

double GetUDMFFloat(int type, int index, const char *key)
{
	assert(type >=0 && type <=3);

	FUDMFKeys *pKeys = UDMFKeys[type].CheckKey(index);

	if (pKeys != NULL)
	{
		FUDMFKey *pKey = pKeys->Find(key);
		if (pKey != NULL)
		{
			return pKey->FloatVal;
		}
	}
	return 0;
}